

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::bone_io::import(bone_io *this,xr_reader *r)

{
  xr_reader *r_local;
  bone_io *this_local;
  
  xr_reader::r_sz(r,&(this->super_xr_bone).m_name);
  xr_reader::r_sz(r,&(this->super_xr_bone).m_parent_name);
  std::__cxx11::string::operator=
            ((string *)&(this->super_xr_bone).m_vmap_name,(string *)&(this->super_xr_bone).m_name);
  (this->super_xr_bone).m_shape.type = 1;
  (this->super_xr_bone).m_shape.flags = 0;
  xr_reader::r<xray_re::_obb<float>>(r,&(this->super_xr_bone).m_shape.box);
  _vector3<float>::set(&(this->super_xr_bone).m_bind_offset,0.0,0.0,0.0);
  _vector3<float>::set(&(this->super_xr_bone).m_bind_rotate,0.0,0.0,0.0);
  (this->super_xr_bone).m_bind_length = 0.5;
  return;
}

Assistant:

inline void xr_ogf_v3::bone_io::import(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	m_vmap_name = m_name;

	m_shape.type = ST_BOX;
	m_shape.flags = 0;
	r.r(m_shape.box);

	// FIXME: reconstruct bind pose here
	m_bind_offset.set();
	m_bind_rotate.set();
	m_bind_length = 0.5f;
}